

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O3

void __thiscall
wabt::intrusive_list<wabt::Expr>::intrusive_list
          (intrusive_list<wabt::Expr> *this,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node)

{
  Expr *pEVar1;
  Expr *pEVar2;
  intrusive_list<wabt::Expr> *piVar3;
  
  this->first_ = (Expr *)0x0;
  this->last_ = (Expr *)0x0;
  this->size_ = 0;
  pEVar1 = (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  if (((pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar1->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    pEVar2 = this->last_;
    piVar3 = this;
    if (pEVar2 != (Expr *)0x0) {
      (pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
      piVar3 = (intrusive_list<wabt::Expr> *)&pEVar2->super_intrusive_list_base<wabt::Expr>;
    }
    piVar3->first_ = pEVar1;
    this->last_ = pEVar1;
    this->size_ = 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

inline intrusive_list<T>::intrusive_list(std::unique_ptr<T> node) {
  push_back(std::move(node));
}